

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_init_alloc
              (uint32_t version,size_t inputs_allocation_len,size_t outputs_allocation_len,
              size_t global_unknowns_allocation_len,wally_psbt **output)

{
  int iVar1;
  wally_psbt *psbt;
  wally_psbt_input *pwVar2;
  wally_psbt_output *pwVar3;
  
  iVar1 = -2;
  if ((output != (wally_psbt **)0x0) && (*output = (wally_psbt *)0x0, version == 0)) {
    psbt = (wally_psbt *)wally_calloc(0x60);
    *output = psbt;
    if (psbt == (wally_psbt *)0x0) {
      iVar1 = -3;
    }
    else {
      if (inputs_allocation_len != 0) {
        pwVar2 = (wally_psbt_input *)wally_calloc(inputs_allocation_len * 0x110);
        psbt->inputs = pwVar2;
      }
      if (outputs_allocation_len != 0) {
        pwVar3 = (wally_psbt_output *)wally_calloc(outputs_allocation_len * 0xd0);
        psbt->outputs = pwVar3;
      }
      iVar1 = wally_map_init(global_unknowns_allocation_len,&psbt->unknowns);
      if (iVar1 == 0) {
        if (((inputs_allocation_len == 0) || (psbt->inputs != (wally_psbt_input *)0x0)) &&
           ((outputs_allocation_len == 0 || (psbt->outputs != (wally_psbt_output *)0x0)))) {
          psbt->version = 0;
          psbt->magic[0] = 'p';
          psbt->magic[1] = 's';
          psbt->magic[2] = 'b';
          psbt->magic[3] = 't';
          psbt->magic[4] = 0xff;
          psbt->inputs_allocation_len = inputs_allocation_len;
          psbt->outputs_allocation_len = outputs_allocation_len;
          psbt->tx = (wally_tx *)0x0;
          return 0;
        }
        iVar1 = -3;
      }
      wally_psbt_free(psbt);
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_init_alloc(uint32_t version, size_t inputs_allocation_len,
                          size_t outputs_allocation_len,
                          size_t global_unknowns_allocation_len,
                          struct wally_psbt **output)
{
    struct wally_psbt *result;
    int ret;

    TX_CHECK_OUTPUT;
    if (version)
        return WALLY_EINVAL; /* Only version 0 is specified/supported */
    TX_OUTPUT_ALLOC(struct wally_psbt);

    if (inputs_allocation_len)
        result->inputs = wally_calloc(inputs_allocation_len * sizeof(struct wally_psbt_input));
    if (outputs_allocation_len)
        result->outputs = wally_calloc(outputs_allocation_len * sizeof(struct wally_psbt_output));

    ret = wally_map_init(global_unknowns_allocation_len, &result->unknowns);

    if (ret != WALLY_OK ||
        (inputs_allocation_len && !result->inputs) || (outputs_allocation_len && !result->outputs)) {
        wally_psbt_free(result);
        return ret != WALLY_OK ? ret : WALLY_ENOMEM;
    }

    result->version = version;
    memcpy(result->magic, PSBT_MAGIC, sizeof(PSBT_MAGIC));
    result->inputs_allocation_len = inputs_allocation_len;
    result->outputs_allocation_len = outputs_allocation_len;
    result->tx = NULL;
    return WALLY_OK;
}